

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

Symbol * findlocsymbol(GlobalVars *gv,ObjectUnit *ou,char *name)

{
  Symbol *pSVar1;
  int iVar2;
  unsigned_long uVar3;
  Symbol **ppSVar4;
  
  ppSVar4 = ou->objsyms;
  uVar3 = elf_hash(name);
  ppSVar4 = ppSVar4 + ((uint)uVar3 & 0x1f);
  while( true ) {
    pSVar1 = *ppSVar4;
    if (pSVar1 == (Symbol *)0x0) {
      return (Symbol *)0x0;
    }
    iVar2 = strcmp(pSVar1->name,name);
    if (iVar2 == 0) break;
    ppSVar4 = &pSVar1->obj_chain;
  }
  return pSVar1;
}

Assistant:

struct Symbol *findlocsymbol(struct GlobalVars *gv,struct ObjectUnit *ou,
                             const char *name)
/* find a symbol which is local to the provided ObjectUnit */
{
  struct Symbol *sym;
  struct Symbol **chain = &ou->objsyms[elf_hash(name)%OBJSYMHTABSIZE];

  while (sym = *chain) {
    if (!strcmp(sym->name,name))
      return sym;
    chain = &sym->obj_chain;
  }
  return NULL;
}